

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O2

bool duckdb::ConvertFloatingToBigint<double>(double value,hugeint_t *result)

{
  double dVar1;
  double dVar2;
  double __x;
  
  if (ABS(value) < 1.7014118346046923e+38 && (ulong)ABS(value) < 0x7ff0000000000000) {
    dVar2 = -value;
    __x = dVar2;
    if (dVar2 <= value) {
      __x = value;
    }
    dVar1 = fmod(__x,1.8446744073709552e+19);
    result->lower = (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
    result->upper = (long)(__x * 5.421010862427522e-20);
    if (value < dVar2) {
      Hugeint::NegateInPlace<true>(result);
    }
  }
  return ABS(value) < 1.7014118346046923e+38 && (ulong)ABS(value) < 0x7ff0000000000000;
}

Assistant:

bool ConvertFloatingToBigint(REAL_T value, hugeint_t &result) {
	if (!Value::IsFinite<REAL_T>(value)) {
		return false;
	}
	if (value <= -170141183460469231731687303715884105728.0 || value >= 170141183460469231731687303715884105727.0) {
		return false;
	}
	bool negative = value < 0;
	if (negative) {
		value = -value;
	}
	result.lower = (uint64_t)fmod(value, REAL_T(NumericLimits<uint64_t>::Maximum()));
	result.upper = (int64_t)(value / REAL_T(NumericLimits<uint64_t>::Maximum()));
	if (negative) {
		Hugeint::NegateInPlace(result);
	}
	return true;
}